

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)1> *the_divider)

{
  DivideTest<long> *in_RDI;
  size_t j;
  size_t i;
  long in_stack_00000038;
  long in_stack_00000040;
  DivideTest<long> *in_stack_00000048;
  undefined8 local_28;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < 10000; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      get_random(in_RDI);
      test_one<(libdivide::Branching)1>
                (in_stack_00000048,in_stack_00000040,in_stack_00000038,
                 (divider<long,_(libdivide::Branching)1> *)this);
    }
  }
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }